

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O1

void addBeta1(NeuralNetwork *nn,OptimizerTypeCase optimizerType,double defaultValue,double minValue,
             double maxValue)

{
  SGDOptimizer *pSVar1;
  NetworkUpdateParameters *pNVar2;
  Optimizer *pOVar3;
  AdamOptimizer *this;
  DoubleParameter *pDVar4;
  DoubleRange *pDVar5;
  
  if (nn->updateparams_ == (NetworkUpdateParameters *)0x0) {
    pNVar2 = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(pNVar2);
    nn->updateparams_ = pNVar2;
  }
  pNVar2 = nn->updateparams_;
  if (pNVar2->optimizer_ == (Optimizer *)0x0) {
    pOVar3 = (Optimizer *)operator_new(0x20);
    CoreML::Specification::Optimizer::Optimizer(pOVar3);
    pNVar2->optimizer_ = pOVar3;
  }
  pOVar3 = pNVar2->optimizer_;
  if (pOVar3->_oneof_case_[0] != 0xb) {
    CoreML::Specification::Optimizer::clear_OptimizerType(pOVar3);
    pOVar3->_oneof_case_[0] = 0xb;
    this = (AdamOptimizer *)operator_new(0x40);
    CoreML::Specification::AdamOptimizer::AdamOptimizer(this);
    (pOVar3->OptimizerType_).adamoptimizer_ = this;
  }
  pSVar1 = (pOVar3->OptimizerType_).sgdoptimizer_;
  if (pSVar1->momentum_ == (DoubleParameter *)0x0) {
    pDVar4 = (DoubleParameter *)operator_new(0x28);
    CoreML::Specification::DoubleParameter::DoubleParameter(pDVar4);
    pSVar1->momentum_ = pDVar4;
  }
  pDVar4 = pSVar1->momentum_;
  pDVar4->defaultvalue_ = defaultValue;
  if (pDVar4->_oneof_case_[0] != 10) {
    CoreML::Specification::DoubleParameter::clear_AllowedValues(pDVar4);
    pDVar4->_oneof_case_[0] = 10;
    pDVar5 = (DoubleRange *)operator_new(0x28);
    CoreML::Specification::DoubleRange::DoubleRange(pDVar5);
    (pDVar4->AllowedValues_).range_ = pDVar5;
  }
  pDVar5 = (pDVar4->AllowedValues_).range_;
  pDVar5->minvalue_ = minValue;
  pDVar5->maxvalue_ = maxValue;
  return;
}

Assistant:

void addBeta1(Specification::NeuralNetwork *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue, double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();
    auto realOptimizer = (::CoreML::Specification::AdamOptimizer*)NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kAdamOptimizer:
            realOptimizer = optimizer->mutable_adamoptimizer();
            break;
        default:
            break;
    }
    
    auto beta1 = realOptimizer->mutable_beta1();
    
    beta1->set_defaultvalue(defaultValue);
    
    auto doubleRange = beta1->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}